

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi_cache.cpp
# Opt level: O3

bool __thiscall
icu_63::RuleBasedBreakIterator::BreakCache::addPreceding
          (BreakCache *this,int32_t position,int32_t ruleStatusIdx,UpdatePositionValues update)

{
  uint uVar1;
  
  uVar1 = this->fStartBufIdx - 1U & 0x7f;
  if (uVar1 == this->fEndBufIdx) {
    if ((update == RetainCachePosition) && (this->fBufIdx == uVar1)) {
      return false;
    }
    this->fEndBufIdx = this->fStartBufIdx + 0x7eU & 0x7f;
  }
  this->fBoundaries[uVar1] = position;
  this->fStatuses[uVar1] = (uint16_t)ruleStatusIdx;
  this->fStartBufIdx = uVar1;
  if (update != UpdateCachePosition) {
    return true;
  }
  this->fBufIdx = uVar1;
  this->fTextIdx = position;
  return true;
}

Assistant:

bool RuleBasedBreakIterator::BreakCache::addPreceding(int32_t position, int32_t ruleStatusIdx, UpdatePositionValues update) {
    U_ASSERT(position < fBoundaries[fStartBufIdx]);
    U_ASSERT(ruleStatusIdx <= UINT16_MAX);
    int32_t nextIdx = modChunkSize(fStartBufIdx - 1);
    if (nextIdx == fEndBufIdx) {
        if (fBufIdx == fEndBufIdx && update == RetainCachePosition) {
            // Failure. The insertion of the new boundary would claim the buffer position that is the
            // current iteration position. And we also want to retain the current iteration position.
            // (The buffer is already completely full of entries that precede the iteration position.)
            return false;
        }
        fEndBufIdx = modChunkSize(fEndBufIdx - 1);
    }
    fBoundaries[nextIdx] = position;
    fStatuses[nextIdx] = static_cast<uint16_t>(ruleStatusIdx);
    fStartBufIdx = nextIdx;
    if (update == UpdateCachePosition) {
        fBufIdx = nextIdx;
        fTextIdx = position;
    }
    return true;
}